

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O1

void quicly_local_cid_init_set
               (quicly_local_cid_set_t *set,quicly_cid_encryptor_t *encryptor,
               quicly_cid_plaintext_t *new_cid)

{
  uint64_t uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  uint64_t *puVar6;
  undefined1 auVar7 [16];
  
  memset(set,0,0xf0);
  set->_size = 1;
  set->_encryptor = encryptor;
  if (new_cid != (quicly_cid_plaintext_t *)0x0) {
    if (new_cid->field_0x4 != '\0') {
      __assert_fail("new_cid->path_id == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                    ,0x56,
                    "void quicly_local_cid_init_set(quicly_local_cid_set_t *, quicly_cid_encryptor_t *, const quicly_cid_plaintext_t *)"
                   );
    }
    uVar2 = *(undefined4 *)&new_cid->field_0x4;
    uVar1 = new_cid->node_id;
    (set->plaintext).master_id = new_cid->master_id;
    *(undefined4 *)&(set->plaintext).field_0x4 = uVar2;
    (set->plaintext).node_id = uVar1;
  }
  if (encryptor != (quicly_cid_encryptor_t *)0x0) {
    if (new_cid == (quicly_cid_plaintext_t *)0x0) {
      __assert_fail("new_cid != NULL && \"master CID must be specified when a non-zero length CID is to be used\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                    ,0x5c,
                    "void quicly_local_cid_init_set(quicly_local_cid_set_t *, quicly_cid_encryptor_t *, const quicly_cid_plaintext_t *)"
                   );
    }
    generate_cid(set,0);
  }
  set->cids[0].state = QUICLY_LOCAL_CID_STATE_DELIVERED;
  auVar4 = _DAT_001388f0;
  auVar3 = _DAT_001388e0;
  puVar6 = &set->cids[1].sequence;
  lVar5 = 0;
  do {
    auVar7._8_4_ = (int)lVar5;
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar7 = (auVar7 | auVar3) ^ auVar4;
    if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7ffffffd) {
      *puVar6 = 0xffffffffffffffff;
      puVar6[7] = 0xffffffffffffffff;
    }
    lVar5 = lVar5 + 2;
    puVar6 = puVar6 + 0xe;
  } while (lVar5 != 4);
  return;
}

Assistant:

void quicly_local_cid_init_set(quicly_local_cid_set_t *set, quicly_cid_encryptor_t *encryptor,
                               const quicly_cid_plaintext_t *new_cid)
{
    *set = (quicly_local_cid_set_t){
        ._encryptor = encryptor,
        ._size = 1,
    };

    /* if provided, set master id */
    if (new_cid != NULL) {
        assert(new_cid->path_id == 0);
        set->plaintext = *new_cid;
    }

    /* initialize cids[0] */
    if (encryptor != NULL) {
        assert(new_cid != NULL && "master CID must be specified when a non-zero length CID is to be used");
        generate_cid(set, 0);
    }
    set->cids[0].state =
        QUICLY_LOCAL_CID_STATE_DELIVERED; /* no need to use NCID frames, the use delivers this CID to the remote peer */

    for (size_t i = 1; i < PTLS_ELEMENTSOF(set->cids); i++)
        set->cids[i].sequence = UINT64_MAX;
}